

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O3

int run_test_timer_huge_timeout(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 uVar2;
  uv_loop_t *unaff_RBX;
  uv_timer_t *puVar3;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_c0 [120];
  uv_loop_t *puStack_48;
  code *pcStack_40;
  void *pvStack_38;
  undefined1 auStack_30 [16];
  undefined8 uStack_20;
  uv__queue *local_18;
  uv__queue *local_10;
  
  uStack_20._0_4_ = 0x1d70a2;
  uStack_20._4_4_ = 0;
  uVar2 = uv_default_loop();
  uStack_20._0_4_ = 0x1d70b1;
  uStack_20._4_4_ = 0;
  iVar1 = uv_timer_init(uVar2,&tiny_timer);
  local_10 = (uv__queue *)(long)iVar1;
  local_18 = (uv__queue *)0x0;
  if (local_10 == (uv__queue *)0x0) {
    uStack_20._0_4_ = 0x1d70d4;
    uStack_20._4_4_ = 0;
    uVar2 = uv_default_loop();
    uStack_20._0_4_ = 0x1d70e3;
    uStack_20._4_4_ = 0;
    iVar1 = uv_timer_init(uVar2,&huge_timer1);
    local_10 = (uv__queue *)(long)iVar1;
    local_18 = (uv__queue *)0x0;
    if (local_10 != (uv__queue *)0x0) goto LAB_001d72ee;
    uStack_20._0_4_ = 0x1d7106;
    uStack_20._4_4_ = 0;
    uVar2 = uv_default_loop();
    uStack_20._0_4_ = 0x1d7115;
    uStack_20._4_4_ = 0;
    iVar1 = uv_timer_init(uVar2,&huge_timer2);
    local_10 = (uv__queue *)(long)iVar1;
    local_18 = (uv__queue *)0x0;
    if (local_10 != (uv__queue *)0x0) goto LAB_001d72fb;
    uStack_20._0_4_ = 0x1d714d;
    uStack_20._4_4_ = 0;
    iVar1 = uv_timer_start(&tiny_timer,tiny_timer_cb,1,0);
    local_10 = (uv__queue *)(long)iVar1;
    local_18 = (uv__queue *)0x0;
    if (local_10 != (uv__queue *)0x0) goto LAB_001d7308;
    unaff_RBX = (uv_loop_t *)0xffffffffffff;
    uStack_20._0_4_ = 0x1d718d;
    uStack_20._4_4_ = 0;
    iVar1 = uv_timer_start(&huge_timer1,tiny_timer_cb,0xffffffffffff,0);
    local_10 = (uv__queue *)(long)iVar1;
    local_18 = (uv__queue *)0x0;
    if (local_10 != (uv__queue *)0x0) goto LAB_001d7315;
    uStack_20._0_4_ = 0x1d71c7;
    uStack_20._4_4_ = 0;
    iVar1 = uv_timer_start(&huge_timer2,tiny_timer_cb,0xffffffffffffffff,0);
    local_10 = (uv__queue *)(long)iVar1;
    local_18 = (uv__queue *)0x0;
    if (local_10 != (uv__queue *)0x0) goto LAB_001d7322;
    local_10 = (uv__queue *)0x1;
    uStack_20._0_4_ = 0x1d71fa;
    uStack_20._4_4_ = 0;
    local_18 = (uv__queue *)uv_timer_get_due_in(&tiny_timer);
    if (local_10 != local_18) goto LAB_001d732f;
    local_10 = (uv__queue *)0xffffffffffff;
    uStack_20._0_4_ = 0x1d721e;
    uStack_20._4_4_ = 0;
    local_18 = (uv__queue *)uv_timer_get_due_in(&huge_timer1);
    if (local_10 != local_18) goto LAB_001d733c;
    local_10 = (uv__queue *)0x0;
    uStack_20._0_4_ = 0x1d7246;
    uStack_20._4_4_ = 0;
    local_18 = (uv__queue *)uv_timer_get_due_in(&huge_timer2);
    if (local_18 < local_10) goto LAB_001d7349;
    uStack_20._0_4_ = 0x1d725e;
    uStack_20._4_4_ = 0;
    uVar2 = uv_default_loop();
    uStack_20._0_4_ = 0x1d7268;
    uStack_20._4_4_ = 0;
    iVar1 = uv_run(uVar2,0);
    local_10 = (uv__queue *)(long)iVar1;
    local_18 = (uv__queue *)0x0;
    if (local_10 != (uv__queue *)0x0) goto LAB_001d7356;
    uStack_20._0_4_ = 0x1d728b;
    uStack_20._4_4_ = 0;
    unaff_RBX = (uv_loop_t *)uv_default_loop();
    uStack_20._0_4_ = 0x1d729f;
    uStack_20._4_4_ = 0;
    uv_walk(unaff_RBX,close_walk_cb,0);
    uStack_20._0_4_ = 0x1d72a9;
    uStack_20._4_4_ = 0;
    uv_run(unaff_RBX,0);
    local_10 = (uv__queue *)0x0;
    uStack_20._0_4_ = 0x1d72b7;
    uStack_20._4_4_ = 0;
    uVar2 = uv_default_loop();
    uStack_20._0_4_ = 0x1d72bf;
    uStack_20._4_4_ = 0;
    iVar1 = uv_loop_close(uVar2);
    local_18 = (uv__queue *)(long)iVar1;
    if (local_10 == local_18) {
      uStack_20._0_4_ = 0x1d72d9;
      uStack_20._4_4_ = 0;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    uStack_20._0_4_ = 0x1d72ee;
    uStack_20._4_4_ = 0;
    run_test_timer_huge_timeout_cold_1();
LAB_001d72ee:
    uStack_20._0_4_ = 0x1d72fb;
    uStack_20._4_4_ = 0;
    run_test_timer_huge_timeout_cold_2();
LAB_001d72fb:
    uStack_20._0_4_ = 0x1d7308;
    uStack_20._4_4_ = 0;
    run_test_timer_huge_timeout_cold_3();
LAB_001d7308:
    uStack_20._0_4_ = 0x1d7315;
    uStack_20._4_4_ = 0;
    run_test_timer_huge_timeout_cold_4();
LAB_001d7315:
    uStack_20._0_4_ = 0x1d7322;
    uStack_20._4_4_ = 0;
    run_test_timer_huge_timeout_cold_5();
LAB_001d7322:
    uStack_20._0_4_ = 0x1d732f;
    uStack_20._4_4_ = 0;
    run_test_timer_huge_timeout_cold_6();
LAB_001d732f:
    uStack_20._0_4_ = 0x1d733c;
    uStack_20._4_4_ = 0;
    run_test_timer_huge_timeout_cold_7();
LAB_001d733c:
    uStack_20._0_4_ = 0x1d7349;
    uStack_20._4_4_ = 0;
    run_test_timer_huge_timeout_cold_8();
LAB_001d7349:
    uStack_20._0_4_ = 0x1d7356;
    uStack_20._4_4_ = 0;
    run_test_timer_huge_timeout_cold_11();
LAB_001d7356:
    uStack_20._0_4_ = 0x1d7363;
    uStack_20._4_4_ = 0;
    run_test_timer_huge_timeout_cold_9();
  }
  puVar3 = (uv_timer_t *)&stack0xfffffffffffffff0;
  uStack_20 = tiny_timer_cb;
  run_test_timer_huge_timeout_cold_10();
  if (puVar3 == &tiny_timer) {
    auStack_30._8_8_ = (uv_loop_t *)0x1d738b;
    uv_close(&tiny_timer,0);
    auStack_30._8_8_ = (uv_loop_t *)0x1d7399;
    uv_close(&huge_timer1,0);
    iVar1 = uv_close(&huge_timer2,0);
    return iVar1;
  }
  auStack_30._8_8_ = run_test_timer_huge_repeat;
  tiny_timer_cb_cold_1();
  pcStack_40 = (code *)0x1d73b7;
  auStack_30._8_8_ = unaff_RBX;
  uVar2 = uv_default_loop();
  pcStack_40 = (code *)0x1d73c6;
  iVar1 = uv_timer_init(uVar2,&tiny_timer);
  auStack_30._0_8_ = SEXT48(iVar1);
  pvStack_38 = (void *)0x0;
  if ((void *)auStack_30._0_8_ == (void *)0x0) {
    pcStack_40 = (code *)0x1d73e9;
    uVar2 = uv_default_loop();
    pcStack_40 = (code *)0x1d73f8;
    iVar1 = uv_timer_init(uVar2,&huge_timer1);
    auStack_30._0_8_ = SEXT48(iVar1);
    pvStack_38 = (void *)0x0;
    if ((void *)auStack_30._0_8_ != (void *)0x0) goto LAB_001d751f;
    pcStack_40 = (code *)0x1d7433;
    iVar1 = uv_timer_start(&tiny_timer,huge_repeat_cb,2,2);
    auStack_30._0_8_ = SEXT48(iVar1);
    pvStack_38 = (void *)0x0;
    if ((void *)auStack_30._0_8_ != (void *)0x0) goto LAB_001d752c;
    pcStack_40 = (code *)0x1d7470;
    iVar1 = uv_timer_start(&huge_timer1,huge_repeat_cb,1,0xffffffffffffffff);
    auStack_30._0_8_ = SEXT48(iVar1);
    pvStack_38 = (void *)0x0;
    if ((void *)auStack_30._0_8_ != (void *)0x0) goto LAB_001d7539;
    pcStack_40 = (code *)0x1d7493;
    uVar2 = uv_default_loop();
    pcStack_40 = (code *)0x1d749d;
    iVar1 = uv_run(uVar2,0);
    auStack_30._0_8_ = SEXT48(iVar1);
    pvStack_38 = (void *)0x0;
    if ((void *)auStack_30._0_8_ != (void *)0x0) goto LAB_001d7546;
    pcStack_40 = (code *)0x1d74c0;
    unaff_RBX = (uv_loop_t *)uv_default_loop();
    pcStack_40 = (code *)0x1d74d4;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_40 = (code *)0x1d74de;
    uv_run(unaff_RBX,0);
    auStack_30._0_8_ = (void *)0x0;
    pcStack_40 = (code *)0x1d74ec;
    uVar2 = uv_default_loop();
    pcStack_40 = (code *)0x1d74f4;
    iVar1 = uv_loop_close(uVar2);
    pvStack_38 = (void *)(long)iVar1;
    if ((void *)auStack_30._0_8_ == pvStack_38) {
      pcStack_40 = (code *)0x1d750a;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_40 = (code *)0x1d751f;
    run_test_timer_huge_repeat_cold_1();
LAB_001d751f:
    pcStack_40 = (code *)0x1d752c;
    run_test_timer_huge_repeat_cold_2();
LAB_001d752c:
    pcStack_40 = (code *)0x1d7539;
    run_test_timer_huge_repeat_cold_3();
LAB_001d7539:
    pcStack_40 = (code *)0x1d7546;
    run_test_timer_huge_repeat_cold_4();
LAB_001d7546:
    pcStack_40 = (code *)0x1d7553;
    run_test_timer_huge_repeat_cold_5();
  }
  puVar3 = (uv_timer_t *)auStack_30;
  pcStack_40 = huge_repeat_cb;
  run_test_timer_huge_repeat_cold_6();
  if (huge_repeat_cb::ncalls == 0) {
    if (puVar3 == &huge_timer1) {
      huge_repeat_cb::ncalls = 1;
      return extraout_EAX;
    }
  }
  else {
    if (puVar3 == &tiny_timer) {
      huge_repeat_cb::ncalls = huge_repeat_cb::ncalls + 1;
      if (huge_repeat_cb::ncalls != 10) {
        return extraout_EAX;
      }
      puStack_48 = (uv_loop_t *)0x1d7592;
      uv_close(&tiny_timer,0);
      iVar1 = uv_close(&huge_timer1,0);
      return iVar1;
    }
    puStack_48 = (uv_loop_t *)0x1d75be;
    huge_repeat_cb_cold_1();
  }
  puStack_48 = (uv_loop_t *)run_test_timer_run_once;
  huge_repeat_cb_cold_2();
  puStack_48 = unaff_RBX;
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,auStack_c0);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(auStack_c0,timer_run_once_timer_cb,0,0);
    if (iVar1 != 0) goto LAB_001d77c3;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_001d77d2;
    if (timer_run_once_timer_cb_called != 1) goto LAB_001d77e1;
    iVar1 = uv_timer_start(auStack_c0,timer_run_once_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_001d77f0;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_001d77ff;
    if (timer_run_once_timer_cb_called != 2) goto LAB_001d780e;
    uv_close(auStack_c0,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d782c;
    }
  }
  else {
    run_test_timer_run_once_cold_1();
LAB_001d77c3:
    run_test_timer_run_once_cold_2();
LAB_001d77d2:
    run_test_timer_run_once_cold_3();
LAB_001d77e1:
    run_test_timer_run_once_cold_4();
LAB_001d77f0:
    run_test_timer_run_once_cold_5();
LAB_001d77ff:
    run_test_timer_run_once_cold_6();
LAB_001d780e:
    run_test_timer_run_once_cold_7();
  }
  run_test_timer_run_once_cold_8();
LAB_001d782c:
  run_test_timer_run_once_cold_9();
  timer_run_once_timer_cb_called = timer_run_once_timer_cb_called + 1;
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(timer_huge_timeout) {
  ASSERT_OK(uv_timer_init(uv_default_loop(), &tiny_timer));
  ASSERT_OK(uv_timer_init(uv_default_loop(), &huge_timer1));
  ASSERT_OK(uv_timer_init(uv_default_loop(), &huge_timer2));
  ASSERT_OK(uv_timer_start(&tiny_timer, tiny_timer_cb, 1, 0));
  ASSERT_OK(uv_timer_start(&huge_timer1,
                           tiny_timer_cb,
                           0xffffffffffffLL,
                           0));
  ASSERT_OK(uv_timer_start(&huge_timer2, tiny_timer_cb, (uint64_t) -1, 0));
  ASSERT_UINT64_EQ(1, uv_timer_get_due_in(&tiny_timer));
  ASSERT_UINT64_EQ(281474976710655, uv_timer_get_due_in(&huge_timer1));
  ASSERT_UINT64_LE(0, uv_timer_get_due_in(&huge_timer2));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}